

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomenoise.c
# Opt level: O0

int mapEnd(EndNoise *en,int *out,int x,int z,int w,int h)

{
  long lVar1;
  void *__ptr;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  int in_R8D;
  int in_R9D;
  int v;
  int ci;
  int cj;
  int j;
  int i;
  int *buf;
  int64_t ch;
  int64_t cw;
  int cz;
  int cx;
  undefined4 local_48;
  undefined4 local_44;
  
  lVar1 = (long)(((in_EDX + in_R8D >> 2) + 1) - (in_EDX >> 2));
  __ptr = malloc(lVar1 * 4 * (long)(((in_ECX + in_R9D >> 2) + 1) - (in_ECX >> 2)));
  mapEndBiome(_cz,(int *)cw,ch._4_4_,(int)ch,buf._4_4_,(int)buf);
  for (local_48 = 0; local_48 < in_R9D; local_48 = local_48 + 1) {
    for (local_44 = 0; local_44 < in_R8D; local_44 = local_44 + 1) {
      *(undefined4 *)(in_RSI + (long)(local_48 * in_R8D + local_44) * 4) =
           *(undefined4 *)
            ((long)__ptr +
            (((in_ECX + local_48 >> 2) - (in_ECX >> 2)) * lVar1 +
            (long)((in_EDX + local_44 >> 2) - (in_EDX >> 2))) * 4);
    }
  }
  free(__ptr);
  return 0;
}

Assistant:

int mapEnd(const EndNoise *en, int *out, int x, int z, int w, int h)
{
    int cx = x >> 2;
    int cz = z >> 2;
    int64_t cw = ((x+w) >> 2) + 1 - cx;
    int64_t ch = ((z+h) >> 2) + 1 - cz;

    int *buf = (int*) malloc(sizeof(int) * cw * ch);
    mapEndBiome(en, buf, cx, cz, cw, ch);

    int i, j;

    for (j = 0; j < h; j++)
    {
        int cj = ((z+j) >> 2) - cz;
        for (i = 0; i < w; i++)
        {
            int ci = ((x+i) >> 2) - cx;
            int v = buf[cj*cw+ci];
            out[j*w+i] = v;
        }
    }

    free(buf);
    return 0;
}